

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalLikeLayerParams::~RandomNormalLikeLayerParams
          (RandomNormalLikeLayerParams *this)

{
  RandomNormalLikeLayerParams *this_local;
  
  ~RandomNormalLikeLayerParams(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

RandomNormalLikeLayerParams::~RandomNormalLikeLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.RandomNormalLikeLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}